

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall
pfederc::FuncExpr::FuncExpr
          (FuncExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *tokId,TemplateDecls *templs,
          vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
          *params,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *returnExpr,
          unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *body,
          bool autoDetectReturnType)

{
  pointer puVar1;
  tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> tVar2;
  pointer puVar3;
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> _Var4;
  long lVar5;
  Expr *pEVar6;
  BodyExpr *pBVar7;
  size_t sVar8;
  iterator __begin1;
  pointer puVar9;
  pointer puVar10;
  tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
  *ptVar11;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_FUNC;
  sVar8 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar8;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Capable).caps._M_t.
  super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
  super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl =
       (caps->_M_t).
       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>.
       _M_t.
       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
       super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
  (caps->_M_t).
  super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
  super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl = (Capabilities *)0x0;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__FuncExpr_00127788;
  this->tokId = tokId;
  puVar9 = (templs->
           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar10 = (params->
            super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (this->params).
  super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (params->
       super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->params).
  super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar10;
  (this->params).
  super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (params->
       super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (params->
  super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (params->
  super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (params->
  super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->returnExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (returnExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (returnExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->body)._M_t.
  super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (body->_M_t).
       super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
       super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
  (body->_M_t).super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl = (BodyExpr *)0x0;
  this->autoDetectReturnType = autoDetectReturnType;
  if (this->tokId == (Token *)0x0) {
    __assert_fail("this->tokId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0xcb,
                  "pfederc::FuncExpr::FuncExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::vector<std::unique_ptr<FuncParameter>> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&, bool)"
                 );
  }
  if ((autoDetectReturnType) &&
     ((this->returnExpr)._M_t.
      super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl != (Expr *)0x0)) {
    __assert_fail("(this->autoDetectReturnType && !this->returnExpr) || !this->autoDetectReturnType"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0xcc,
                  "pfederc::FuncExpr::FuncExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::vector<std::unique_ptr<FuncParameter>> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&, bool)"
                 );
  }
  puVar1 = (this->templs).
           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->templs).
                super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    tVar2.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> *)
          &(((puVar9->_M_t).
             super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
             ._M_t.
             super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
             .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>._M_head_impl)->expr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    if (tVar2.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
      *(FuncExpr **)
       ((long)tVar2.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
              super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8) = this;
    }
  }
  puVar3 = (this->params).
           super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (this->params).
                 super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3; puVar10 = puVar10 + 1
      ) {
    *(FuncExpr **)
     ((long)(((_Head_base<2UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
               *)((long)&(((puVar10->_M_t).
                           super___uniq_ptr_impl<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                           .
                           super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
                          ._M_head_impl)->
                         super__Tuple_impl<0UL,_const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                         ).
                         super__Tuple_impl<1UL,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                 + 0x10))->_M_head_impl)._M_t + 8) = this;
    ptVar11 = (puVar10->_M_t).
              super___uniq_ptr_impl<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
              .
              super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
              ._M_head_impl;
    _Var4._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         *(tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> *)
          &(((_Head_base<3UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
              *)((long)&(ptVar11->
                        super__Tuple_impl<0UL,_const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                        ).
                        super__Tuple_impl<1UL,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                + 8))->_M_head_impl)._M_t;
    if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
        _Var4._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
      *(FuncExpr **)
       ((long)_Var4._M_t.
              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
              super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8) = this;
      ptVar11 = (puVar10->_M_t).
                super___uniq_ptr_impl<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                .
                super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
                ._M_head_impl;
    }
    lVar5 = *(long *)&(ptVar11->
                      super__Tuple_impl<0UL,_const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                      ).
                      super__Tuple_impl<1UL,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                      .
                      super__Tuple_impl<2UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
    ;
    if (lVar5 != 0) {
      *(FuncExpr **)(lVar5 + 8) = this;
    }
  }
  pEVar6 = (this->returnExpr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar6 != (Expr *)0x0) {
    pEVar6->parent = &this->super_Expr;
  }
  pBVar7 = (this->body)._M_t.
           super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
           super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
  if (pBVar7 != (BodyExpr *)0x0) {
    (pBVar7->super_Expr).parent = &this->super_Expr;
  }
  return;
}

Assistant:

FuncExpr::FuncExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *tokId,
    TemplateDecls &&templs,
    std::vector<std::unique_ptr<FuncParameter>> &&params,
    std::unique_ptr<Expr> &&returnExpr,
    std::unique_ptr<BodyExpr> &&body,
    bool autoDetectReturnType) noexcept
    : Expr(lexer, ExprType::EXPR_FUNC, pos), Capable(std::move(caps)), tokId{tokId},
      templs(std::move(templs)), params(std::move(params)),
      returnExpr(std::move(returnExpr)), body(std::move(body)),
      autoDetectReturnType{autoDetectReturnType} {
  assert(this->tokId);
  assert((this->autoDetectReturnType && !this->returnExpr) || !this->autoDetectReturnType);

  _setTemplateParents(this->templs, this);
  _setParameterParents(this->params, this);
  _setParent(this->returnExpr, this);
  _setParent(this->body, this);
}